

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::GreaterThanLayerParams::_InternalSerialize
          (GreaterThanLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint8_t *puVar1;
  ulong uVar2;
  
  if (this->alpha_ != 0.0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray(2,this->alpha_,puVar1);
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  uVar2 = uVar2 & 0xfffffffffffffffc;
  puVar1 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar2 + 8),*(int *)(uVar2 + 0x10),target);
  return puVar1;
}

Assistant:

uint8_t* GreaterThanLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.GreaterThanLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // float alpha = 2;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_alpha = this->_internal_alpha();
  uint32_t raw_alpha;
  memcpy(&raw_alpha, &tmp_alpha, sizeof(tmp_alpha));
  if (raw_alpha != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(2, this->_internal_alpha(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.GreaterThanLayerParams)
  return target;
}